

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AIMultiplayer.cpp
# Opt level: O1

void XPMP2::AIMultiClearTcasDataRefs(void)

{
  vector<int,_std::allocator<int>_> nullArr;
  allocator_type local_25;
  value_type_conflict4 local_24;
  vector<int,_std::allocator<int>_> local_20;
  
  if (drTcasModeS != 0) {
    local_24 = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_20,CONCAT44(numSlots._4_4_,(undefined4)numSlots),&local_24,&local_25);
    XPLMSetDatavi(drTcasModeS,
                  local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,1,(undefined4)numSlots);
    if (local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void AIMultiClearTcasDataRefs ()
{
    if (drTcasModeS) {
        std::vector<int> nullArr (numSlots, 0);
        XPLMSetDatavi(drTcasModeS, nullArr.data(), 1, (int)numSlots);
    }
}